

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O1

void gimage::reduceGauss<unsigned_char,unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *target,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image)

{
  byte bVar1;
  uchar ***pppuVar2;
  long lVar3;
  long lVar4;
  byte *pbVar5;
  long lVar6;
  float *pfVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uchar *puVar13;
  long i;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  ImageFloat tmp;
  long local_88;
  Image<float,_gimage::PixelTraits<float>_> local_68;
  
  local_68.depth = 0;
  local_68.width = 0;
  local_68.height = 0;
  local_68.n = 0;
  local_68.pixel = (float *)0x0;
  local_68.row = (float **)0x0;
  local_68.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (&local_68,(image->width - (image->width + 1 >> 0x3f)) + 1 >> 1,image->height,1);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (target,(image->width - (image->width + 1 >> 0x3f)) + 1 >> 1,
             (image->height - (image->height + 1 >> 0x3f)) + 1 >> 1,(long)image->depth);
  uVar9 = (ulong)(uint)image->depth;
  if (0 < image->depth) {
    local_88 = 0;
    do {
      lVar11 = image->height;
      if (0 < lVar11) {
        pfVar7 = **local_68.img;
        lVar12 = image->width;
        iVar8 = (int)uVar9 + -1;
        if ((int)local_88 < iVar8) {
          iVar8 = (int)local_88;
        }
        lVar16 = 0;
        do {
          if (0 < lVar12) {
            lVar15 = lVar11 + -1;
            if (lVar16 < lVar11 + -1) {
              lVar15 = lVar16;
            }
            pppuVar2 = image->img;
            lVar14 = 0;
            do {
              if (lVar14 == 0 || lVar12 + -2 <= lVar14) {
                fVar17 = 0.0;
                lVar6 = 0;
                lVar10 = lVar14;
                do {
                  lVar4 = 2;
                  if (2 < lVar10) {
                    lVar4 = lVar10;
                  }
                  lVar3 = lVar4 + -2;
                  if (lVar12 + -1 <= lVar4 + -2) {
                    lVar3 = lVar12 + -1;
                  }
                  fVar17 = fVar17 + (float)pppuVar2[iVar8][lVar15][lVar3] *
                                    *(float *)((long)reduceGauss<unsigned_char,_unsigned_char>::g +
                                              lVar6);
                  lVar6 = lVar6 + 4;
                  lVar10 = lVar10 + 1;
                } while (lVar6 != 0x14);
              }
              else {
                pbVar5 = pppuVar2[local_88][lVar16] + lVar14 + -2;
                fVar17 = 0.0;
                lVar10 = 0;
                do {
                  bVar1 = *pbVar5;
                  pbVar5 = pbVar5 + 1;
                  fVar17 = fVar17 + (float)bVar1 *
                                    *(float *)((long)reduceGauss<unsigned_char,_unsigned_char>::g +
                                              lVar10);
                  lVar10 = lVar10 + 4;
                } while (lVar10 != 0x14);
              }
              *pfVar7 = fVar17;
              pfVar7 = pfVar7 + 1;
              lVar14 = lVar14 + 2;
            } while (lVar14 < lVar12);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != lVar11);
      }
      if (0 < local_68.width) {
        lVar11 = 0;
        lVar12 = 0;
        do {
          if (0 < local_68.height) {
            puVar13 = *target->img[local_88] + lVar12;
            lVar16 = 0;
            do {
              if ((lVar16 == 0) || (local_68.height + -2 <= lVar16)) {
                lVar15 = local_68.width + -1;
                if (lVar12 < local_68.width + -1) {
                  lVar15 = lVar12;
                }
                iVar8 = local_68.depth;
                if (0 < local_68.depth) {
                  iVar8 = 1;
                }
                fVar17 = 0.0;
                lVar10 = 0;
                lVar14 = lVar16;
                do {
                  lVar6 = 2;
                  if (2 < lVar14) {
                    lVar6 = lVar14;
                  }
                  lVar4 = lVar6 + -2;
                  if (local_68.height + -1 <= lVar6 + -2) {
                    lVar4 = local_68.height + -1;
                  }
                  fVar17 = fVar17 + *(float *)((long)reduceGauss<unsigned_char,_unsigned_char>::g +
                                              lVar10) *
                                    local_68.img[(long)iVar8 + -1][lVar4][lVar15];
                  lVar10 = lVar10 + 4;
                  lVar14 = lVar14 + 1;
                } while (lVar10 != 0x14);
              }
              else {
                pfVar7 = (float *)((long)(*local_68.img)[lVar16 + -2] + lVar11);
                fVar17 = 0.0;
                lVar15 = 0;
                do {
                  fVar17 = fVar17 + *(float *)((long)reduceGauss<unsigned_char,_unsigned_char>::g +
                                              lVar15) * *pfVar7;
                  lVar15 = lVar15 + 4;
                  pfVar7 = pfVar7 + local_68.width;
                } while (lVar15 != 0x14);
              }
              *puVar13 = (uchar)(int)fVar17;
              puVar13 = puVar13 + target->width;
              lVar16 = lVar16 + 2;
            } while (lVar16 < local_68.height);
          }
          lVar12 = lVar12 + 1;
          lVar11 = lVar11 + 4;
        } while (lVar12 < local_68.width);
      }
      local_88 = local_88 + 1;
      uVar9 = (ulong)image->depth;
    } while (local_88 < (long)uVar9);
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_68);
  return;
}

Assistant:

void reduceGauss(Image<T> &target, const Image<S> &image)
{
  static const float g[]={0.0625, 0.25, 0.375, 0.25, 0.0625};

  // intermediate image with downscaled width

  ImageFloat tmp((image.getWidth()+1)/2, image.getHeight(), 1);

  // downscaled target image

  target.setSize((image.getWidth()+1)/2, (image.getHeight()+1)/2, image.getDepth());

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal into horizontally downscaled intermediate image

    float *tmpp=tmp.getPtr(0, 0, 0);
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i+=2)
      {
        float pv=0;

        if (i >= 2 && i < image.getWidth()-2)
        {
          S *p=image.getPtr(i-2, k, d);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p++;
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*image.getBounds(i+j-2, k, d);
          }
        }

        *tmpp++=pv;
      }
    }

    // convolve vertically into downscaled target image

    for (long i=0; i<tmp.getWidth(); i++)
    {
      T *tp=target.getPtr(i, 0, d);
      for (long k=0; k<tmp.getHeight(); k+=2)
      {
        float pv=0;

        if (k >= 2 && k < tmp.getHeight()-2)
        {
          float *p=tmp.getPtr(i, k-2, 0);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p;
            p+=tmp.getWidth();
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*tmp.getBounds(i, k+j-2, 0);
          }
        }

        *tp=static_cast<T>(pv);
        tp+=target.getWidth();
      }
    }
  }
}